

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O1

void __thiscall
enact::ReferenceTypename::ReferenceTypename(ReferenceTypename *this,ReferenceTypename *typename_)

{
  _Head_base<0UL,_const_enact::Typename_*,_false> local_90;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_88;
  _Optional_payload_base<enact::Token> local_80;
  _Optional_payload_base<enact::Token> local_48;
  
  std::_Optional_payload_base<enact::Token>::_Optional_payload_base
            (&local_48,
             (typename_->m_permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_engaged,
             (_Optional_payload_base<enact::Token> *)&typename_->m_permission);
  std::_Optional_payload_base<enact::Token>::_Optional_payload_base
            (&local_80,
             (typename_->m_region).super__Optional_base<enact::Token,_false,_false>._M_payload.
             super__Optional_payload<enact::Token,_true,_false,_false>.
             super__Optional_payload_base<enact::Token>._M_engaged,
             (_Optional_payload_base<enact::Token> *)&typename_->m_region);
  (*((typename_->m_referringTypename)._M_t.
     super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>._M_t.
     super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>.
     super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[2])
            (&local_90);
  local_88._M_head_impl = local_90._M_head_impl;
  local_90._M_head_impl = (Typename *)0x0;
  ReferenceTypename(this,(optional<enact::Token> *)&local_48,(optional<enact::Token> *)&local_80,
                    (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                     *)&local_88);
  if (local_88._M_head_impl != (Typename *)0x0) {
    (*(local_88._M_head_impl)->_vptr_Typename[1])();
  }
  local_88._M_head_impl = (Typename *)0x0;
  if (local_90._M_head_impl != (Typename *)0x0) {
    (*(local_90._M_head_impl)->_vptr_Typename[1])();
  }
  if (local_80._M_engaged == true) {
    local_80._M_engaged = false;
    if (local_80._M_payload._M_value.lexeme._M_dataplus._M_p !=
        (pointer)((long)&local_80._M_payload + 0x18)) {
      operator_delete((void *)local_80._M_payload._M_value.lexeme._M_dataplus._M_p,
                      local_80._M_payload._24_8_ + 1);
    }
  }
  if (local_48._M_engaged == true) {
    local_48._M_engaged = false;
    if (local_48._M_payload._M_value.lexeme._M_dataplus._M_p !=
        (pointer)((long)&local_48._M_payload + 0x18)) {
      operator_delete((void *)local_48._M_payload._M_value.lexeme._M_dataplus._M_p,
                      local_48._M_payload._24_8_ + 1);
    }
  }
  return;
}

Assistant:

ReferenceTypename::ReferenceTypename(const ReferenceTypename& typename_) :
            ReferenceTypename{
                    typename_.m_permission,
                    typename_.m_region,
                    typename_.m_referringTypename->clone()} {
    }